

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O1

avl_node * avl_find(avl_tree *tree,void *key)

{
  avl_node *paVar1;
  avl_node *paVar2;
  int diff;
  int local_c;
  
  if (tree->root != (avl_node *)0x0) {
    paVar1 = _avl_find_rec(tree->root,key,tree->comp,&local_c);
    paVar2 = (avl_node *)0x0;
    if (local_c == 0) {
      paVar2 = paVar1;
    }
    return paVar2;
  }
  return (avl_node *)0x0;
}

Assistant:

struct avl_node *
avl_find(const struct avl_tree *tree, const void *key) {
  struct avl_node *node;
  int diff;

  if (tree->root == NULL)
    return NULL;

  node = _avl_find_rec(tree->root, key, tree->comp, &diff);

  return diff == 0 ? node : NULL;
}